

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::DOMDocumentImpl::cloneString(DOMDocumentImpl *this,XMLCh *src)

{
  short *psVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  XMLCh *target;
  
  if (src == (XMLCh *)0x0) {
    target = (XMLCh *)0x0;
  }
  else {
    lVar3 = 0;
    do {
      psVar1 = (short *)((long)src + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this,(ulong)((uint)lVar3 & 2) + lVar3);
    target = (XMLCh *)CONCAT44(extraout_var,iVar2);
    XMLString::copyString(target,src);
  }
  return target;
}

Assistant:

XMLCh * DOMDocumentImpl::cloneString(const XMLCh *src)
{
    if (!src) return 0;
    XMLSize_t len = XMLString::stringLen(src);
    len = (len + 1) * sizeof(XMLCh);
    len = (len % 4) + len;
    XMLCh *newStr = (XMLCh *)this->allocate(len);
    XMLString::copyString(newStr, src);
    return newStr;
}